

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.cpp
# Opt level: O0

double __thiscall tri_cc_geom_t::get_tri_area(tri_cc_geom_t *this,cellid_t c)

{
  uint uVar1;
  ostream *poVar2;
  runtime_error *this_00;
  const_reference p;
  const_reference q;
  const_reference r;
  double dVar3;
  int local_228;
  int local_224;
  cellid_t pts [20];
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [380];
  cellid_t local_14;
  tri_cc_geom_t *ptStack_10;
  cellid_t c_local;
  tri_cc_geom_t *this_local;
  
  local_14 = c;
  ptStack_10 = this;
  uVar1 = get_cell_dim(this,c);
  if (uVar1 != 2) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(local_190,"Failed to assert condition ");
    poVar2 = std::operator<<(poVar2,"get_cell_dim(c) == 2");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"at (");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/tri_edge.cpp"
                            );
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = std::operator<<(poVar2,"get_tri_area");
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x27d);
    std::operator<<(poVar2,") \n ");
    pts[0x13]._3_1_ = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this_00,local_1d0);
    pts[0x13]._3_1_ = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  get_cell_points(this,local_14,&local_228);
  p = std::
      vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
      ::operator[](&this->m_cell_pos,(long)local_228);
  q = std::
      vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
      ::operator[](&this->m_cell_pos,(long)local_224);
  r = std::
      vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
      ::operator[](&this->m_cell_pos,(long)pts[0]);
  dVar3 = la::tri_area<double,3u>(p,q,r);
  return dVar3;
}

Assistant:

double tri_cc_geom_t::get_tri_area(cellid_t c) const
{
  ASSERT(get_cell_dim(c) == 2);

  cellid_t pts[20];

  get_cell_points(c,pts);

  return la::tri_area<double,3>
      (m_cell_pos[pts[0]],m_cell_pos[pts[1]],m_cell_pos[pts[2]]);
}